

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

string * __thiscall
vkt::shaderexecutor::
GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,float,int,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
::getDesc_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(**(long **)((long)this + 8) + 0x10))(&local_30);
  std::operator+(&local_50,"Function \'",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"\'");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string				getDesc				(void) const { return "Function '" + m_funcs.func.getName() + "'"; }